

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_fixed_wnaf_small_helper(int *wnaf,int *wnaf_expected,int w)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  secp256k1_scratch *psVar6;
  ulong extraout_RAX;
  code *pcVar7;
  long lVar8;
  secp256k1_scalar *psVar9;
  long extraout_RDX;
  ulong uVar10;
  secp256k1_scratch *scratch;
  size_t sVar11;
  secp256k1_gej *r;
  secp256k1_strauss_point_state *psVar12;
  byte *out32;
  secp256k1_gej *psVar13;
  secp256k1_ge *elem;
  code *cb;
  secp256k1_scalar *cbdata;
  secp256k1_fe *unaff_R12;
  secp256k1_sha256 *hash;
  secp256k1_gej *psVar14;
  secp256k1_ge *unaff_R13;
  secp256k1_scalar *psVar15;
  secp256k1_sha256 *acc;
  secp256k1_gej *psVar16;
  bool bVar17;
  ulong uStack_2078;
  secp256k1_strauss_state sStack_2060;
  secp256k1_fe asStack_2048 [8];
  secp256k1_strauss_point_state sStack_1f08;
  secp256k1_ge asStack_1af8 [8];
  size_t *psStack_1830;
  secp256k1_gej *psStack_1828;
  secp256k1_gej *psStack_1820;
  secp256k1_gej *psStack_1818;
  secp256k1_gej *psStack_1810;
  secp256k1_strauss_point_state *psStack_1808;
  size_t sStack_17e8;
  secp256k1_scalar sStack_17e0;
  secp256k1_scratch asStack_17c0 [2];
  secp256k1_ge sStack_1778;
  secp256k1_gej sStack_1720;
  secp256k1_gej sStack_16a0;
  secp256k1_gej sStack_1620;
  secp256k1_gej sStack_15a0;
  secp256k1_gej sStack_1520;
  secp256k1_gej asStack_14a0 [2];
  secp256k1_gej asStack_1360 [5];
  secp256k1_strauss_point_state sStack_10a0;
  secp256k1_gej *psStack_c88;
  secp256k1_sha256 *psStack_c80;
  secp256k1_scratch *psStack_c78;
  secp256k1_sha256 *psStack_c70;
  secp256k1_gej *psStack_c68;
  code *pcStack_c60;
  undefined4 uStack_c56;
  undefined2 uStack_c52;
  long lStack_c50;
  byte abStack_c48 [32];
  undefined1 auStack_c28 [40];
  uchar auStack_c00 [88];
  undefined8 uStack_ba8;
  secp256k1_sha256 sStack_b98;
  secp256k1_gej *psStack_b30;
  secp256k1_fe *psStack_b28;
  secp256k1_ge *psStack_b20;
  secp256k1_ge *psStack_b18;
  secp256k1_gej *psStack_b10;
  secp256k1_strauss_point_state *psStack_b08;
  undefined1 auStack_b00 [32];
  undefined1 auStack_ae0 [40];
  uint64_t uStack_ab8;
  uint64_t uStack_ab0;
  uint64_t uStack_aa8;
  uint64_t uStack_aa0;
  uint64_t uStack_a98;
  uint64_t uStack_a90;
  uint64_t uStack_a88;
  uint64_t uStack_a80;
  uint64_t uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 uStack_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  int iStack_a48;
  secp256k1_strauss_state sStack_a40;
  secp256k1_gej sStack_a28;
  secp256k1_gej sStack_9a8;
  secp256k1_gej sStack_928;
  secp256k1_ge sStack_8a8;
  secp256k1_fe asStack_850 [8];
  secp256k1_ge asStack_710 [8];
  secp256k1_strauss_point_state sStack_450;
  
  uVar5 = 0x20;
  do {
    uVar3 = (int)uVar5 - 1;
    uVar5 = (ulong)uVar3;
    if (wnaf[uVar5] != 0) {
      test_fixed_wnaf_small_helper_cold_1();
      goto LAB_001642be;
    }
  } while (8 < uVar3);
  uVar3 = 7;
  while (wnaf[uVar3] == wnaf_expected[uVar3]) {
    bVar17 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar17) {
      return;
    }
  }
LAB_001642be:
  test_fixed_wnaf_small_helper_cold_2();
  psVar16 = (secp256k1_gej *)auStack_b00;
  psVar12 = (secp256k1_strauss_point_state *)((ulong)wnaf_expected & 0xffffffff);
  psVar15 = (secp256k1_scalar *)auStack_ae0;
  psStack_b08 = (secp256k1_strauss_point_state *)0x1642e6;
  random_scalar_order_test(psVar15);
  psStack_b08 = (secp256k1_strauss_point_state *)0x1642f7;
  secp256k1_scalar_add((secp256k1_scalar *)auStack_b00,psVar15,(secp256k1_scalar *)wnaf);
  psStack_b08 = (secp256k1_strauss_point_state *)0x164302;
  secp256k1_scalar_negate((secp256k1_scalar *)auStack_b00,(secp256k1_scalar *)auStack_b00);
  if ((int)wnaf_expected == 0) {
    psStack_b08 = (secp256k1_strauss_point_state *)0x164457;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_928,(secp256k1_scalar *)auStack_ae0);
    psStack_b08 = (secp256k1_strauss_point_state *)0x16446e;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_9a8,(secp256k1_scalar *)auStack_b00);
    psStack_b08 = (secp256k1_strauss_point_state *)0x164485;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_a28,(secp256k1_scalar *)wnaf);
  }
  else {
    psStack_b08 = (secp256k1_strauss_point_state *)0x16431a;
    random_group_element_test(&sStack_8a8);
    iStack_a48 = sStack_8a8.infinity;
    auStack_ae0._32_8_ = sStack_8a8.x.n[0];
    uStack_ab8 = sStack_8a8.x.n[1];
    uStack_ab0 = sStack_8a8.x.n[2];
    uStack_aa8 = sStack_8a8.x.n[3];
    uStack_aa0 = sStack_8a8.x.n[4];
    uStack_a98 = sStack_8a8.y.n[0];
    uStack_a90 = sStack_8a8.y.n[1];
    uStack_a88 = sStack_8a8.y.n[2];
    uStack_a80 = sStack_8a8.y.n[3];
    uStack_a78 = sStack_8a8.y.n[4];
    uStack_a70 = 1;
    uStack_a68 = 0;
    uStack_a60 = 0;
    uStack_a58 = 0;
    uStack_a50 = 0;
    if ((int)wnaf_expected == 1) {
      unaff_R12 = asStack_850;
      unaff_R13 = asStack_710;
      psVar12 = &sStack_450;
      psVar15 = &test_ecmult_target::zero;
      psVar16 = (secp256k1_gej *)(auStack_ae0 + 0x20);
      psStack_b08 = (secp256k1_strauss_point_state *)0x1643dd;
      sStack_9a8.x.n[0] = (uint64_t)unaff_R12;
      sStack_9a8.x.n[1] = (uint64_t)unaff_R13;
      sStack_9a8.x.n[2] = (uint64_t)psVar12;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_9a8,&sStack_928,1,psVar16,
                 (secp256k1_scalar *)auStack_ae0,&test_ecmult_target::zero);
      psStack_b08 = (secp256k1_strauss_point_state *)0x16440b;
      sStack_a28.x.n[0] = (uint64_t)unaff_R12;
      sStack_a28.x.n[1] = (uint64_t)unaff_R13;
      sStack_a28.x.n[2] = (uint64_t)psVar12;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_a28,&sStack_9a8,1,psVar16,
                 (secp256k1_scalar *)auStack_b00,&test_ecmult_target::zero);
      psStack_b08 = (secp256k1_strauss_point_state *)0x164439;
      sStack_a40.aux = unaff_R12;
      sStack_a40.pre_a = unaff_R13;
      sStack_a40.ps = psVar12;
      secp256k1_ecmult_strauss_wnaf
                (&sStack_a40,&sStack_a28,1,psVar16,(secp256k1_scalar *)wnaf,
                 &test_ecmult_target::zero);
    }
    else {
      psVar15 = (secp256k1_scalar *)&sStack_8a8;
      psStack_b08 = (secp256k1_strauss_point_state *)0x1644a4;
      secp256k1_ecmult_const(&sStack_928,(secp256k1_ge *)psVar15,(secp256k1_scalar *)auStack_ae0);
      psStack_b08 = (secp256k1_strauss_point_state *)0x1644b7;
      secp256k1_ecmult_const(&sStack_9a8,(secp256k1_ge *)psVar15,(secp256k1_scalar *)auStack_b00);
      psStack_b08 = (secp256k1_strauss_point_state *)0x1644ca;
      secp256k1_ecmult_const(&sStack_a28,(secp256k1_ge *)psVar15,(secp256k1_scalar *)wnaf);
      psVar16 = (secp256k1_gej *)auStack_b00;
    }
  }
  psStack_b08 = (secp256k1_strauss_point_state *)0x1644e7;
  secp256k1_gej_add_var(&sStack_a28,&sStack_a28,&sStack_928,(secp256k1_fe *)0x0);
  psStack_b08 = (secp256k1_strauss_point_state *)0x1644fc;
  psVar13 = &sStack_a28;
  psVar14 = &sStack_a28;
  secp256k1_gej_add_var(&sStack_a28,&sStack_a28,&sStack_9a8,(secp256k1_fe *)0x0);
  if (sStack_a28.infinity != 0) {
    return;
  }
  psStack_b08 = (secp256k1_strauss_point_state *)test_ecmult_constants_sha;
  test_ecmult_target_cold_1();
  out32 = (byte *)((ulong)psVar14 & 0xffffffff);
  pcStack_c60 = (code *)0x16454a;
  lStack_c50 = extraout_RDX;
  psStack_b30 = &sStack_a28;
  psStack_b28 = unaff_R12;
  psStack_b20 = unaff_R13;
  psStack_b18 = (secp256k1_ge *)psVar15;
  psStack_b10 = psVar16;
  psStack_b08 = psVar12;
  psVar6 = secp256k1_scratch_create(&CTX->error_callback,0x10000);
  uStack_c56 = SUB84(psVar14,0);
  acc = &sStack_b98;
  sStack_b98.s[0] = 0x6a09e667;
  sStack_b98.s[1] = 0xbb67ae85;
  sStack_b98.s[2] = 0x3c6ef372;
  sStack_b98.s[3] = 0xa54ff53a;
  sStack_b98.s[4] = 0x510e527f;
  sStack_b98.s[5] = 0x9b05688c;
  sStack_b98.s[6] = 0x1f83d9ab;
  sStack_b98.s[7] = 0x5be0cd19;
  psVar16 = (secp256k1_gej *)0x0;
  sStack_b98.bytes = 0;
  hash = (secp256k1_sha256 *)auStack_c28;
  auStack_c28._0_4_ = 0;
  auStack_c28._4_4_ = 0;
  auStack_c28._8_4_ = 0;
  auStack_c28._12_4_ = 0;
  auStack_c28._16_4_ = 0;
  auStack_c28._20_4_ = 0;
  auStack_c28._24_4_ = 0;
  auStack_c28._28_4_ = 0;
  pcStack_c60 = (code *)0x164597;
  test_ecmult_accumulate(acc,(secp256k1_scalar *)hash,psVar6);
  auStack_c28._0_4_ = 1;
  auStack_c28._4_4_ = 0;
  auStack_c28._8_4_ = 0;
  auStack_c28._12_4_ = 0;
  auStack_c28._16_4_ = 0;
  auStack_c28._20_4_ = 0;
  auStack_c28._24_4_ = 0;
  auStack_c28._28_4_ = 0;
  pcStack_c60 = (code *)0x1645bb;
  test_ecmult_accumulate(acc,(secp256k1_scalar *)hash,psVar6);
  pcStack_c60 = (code *)0x1645c6;
  secp256k1_scalar_negate((secp256k1_scalar *)hash,(secp256k1_scalar *)hash);
  pcStack_c60 = (code *)0x1645d4;
  test_ecmult_accumulate(acc,(secp256k1_scalar *)hash,psVar6);
  if (psVar13 != (secp256k1_gej *)0x0) {
    psVar16 = (secp256k1_gej *)0x0;
    hash = (secp256k1_sha256 *)(auStack_c28 + 0x20);
    out32 = abStack_c48;
    acc = (secp256k1_sha256 *)auStack_c28;
    do {
      uStack_c52 = SUB82(psVar16,0);
      auStack_c28[0x20] = 'g';
      auStack_c28[0x21] = 0xe6;
      auStack_c28[0x22] = '\t';
      auStack_c28[0x23] = 'j';
      auStack_c28[0x24] = 0x85;
      auStack_c28[0x25] = 0xae;
      auStack_c28[0x26] = 'g';
      auStack_c28[0x27] = 0xbb;
      auStack_c00[0] = 'r';
      auStack_c00[1] = 0xf3;
      auStack_c00[2] = 'n';
      auStack_c00[3] = '<';
      auStack_c00[4] = ':';
      auStack_c00[5] = 0xf5;
      auStack_c00[6] = 'O';
      auStack_c00[7] = 0xa5;
      auStack_c00[8] = '\x7f';
      auStack_c00[9] = 'R';
      auStack_c00[10] = '\x0e';
      auStack_c00[0xb] = 'Q';
      auStack_c00[0xc] = 0x8c;
      auStack_c00[0xd] = 'h';
      auStack_c00[0xe] = '\x05';
      auStack_c00[0xf] = 0x9b;
      auStack_c00[0x10] = 0xab;
      auStack_c00[0x11] = 0xd9;
      auStack_c00[0x12] = 0x83;
      auStack_c00[0x13] = '\x1f';
      auStack_c00[0x14] = '\x19';
      auStack_c00[0x15] = 0xcd;
      auStack_c00[0x16] = 0xe0;
      auStack_c00[0x17] = '[';
      uStack_ba8 = 0;
      pcStack_c60 = (code *)0x164625;
      secp256k1_sha256_write(hash,(uchar *)&uStack_c56,6);
      pcStack_c60 = (code *)0x164630;
      secp256k1_sha256_finalize(hash,out32);
      pcStack_c60 = (code *)0x16463d;
      secp256k1_scalar_set_b32((secp256k1_scalar *)acc,out32,(int *)0x0);
      pcStack_c60 = (code *)0x164650;
      test_ecmult_accumulate(&sStack_b98,(secp256k1_scalar *)acc,psVar6);
      psVar16 = (secp256k1_gej *)((long)(psVar16->x).n + 1);
    } while (psVar13 != psVar16);
  }
  pcStack_c60 = (code *)0x16466a;
  secp256k1_sha256_finalize(&sStack_b98,abStack_c48);
  lVar8 = 0;
  uVar5 = extraout_RAX;
  do {
    uVar10 = uVar5 & 0xffffffff;
    bVar1 = abStack_c48[lVar8];
    psVar15 = (secp256k1_scalar *)(ulong)bVar1;
    bVar2 = *(byte *)(lStack_c50 + lVar8);
    psVar14 = (secp256k1_gej *)(ulong)bVar2;
    uVar5 = (ulong)((uint)bVar1 - (uint)bVar2);
    if (bVar1 == bVar2) {
      uVar5 = uVar10;
    }
    iVar4 = (int)uVar5;
    if (bVar1 != bVar2) goto LAB_00164694;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x20);
  iVar4 = 0;
LAB_00164694:
  if (iVar4 == 0) {
    pcStack_c60 = (code *)0x1646ac;
    secp256k1_scratch_destroy(&CTX->error_callback,psVar6);
    return;
  }
  pcStack_c60 = test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  sStack_17e0.d[2] = 0;
  sStack_17e0.d[3] = 0;
  sStack_17e0.d[0] = 0;
  sStack_17e0.d[1] = 0;
  sStack_17e8 = 0x41;
  sStack_1520.infinity = 0;
  sStack_1520.x.n[0] = 0x2815b16f81798;
  sStack_1520.x.n[1] = 0xdb2dce28d959f;
  sStack_1520.x.n[2] = 0xe870b07029bfc;
  sStack_1520.x.n[3] = 0xbbac55a06295c;
  sStack_1520.x.n[4] = 0x79be667ef9dc;
  sStack_1520.y.n[4] = 0x483ada7726a3;
  sStack_1520.y.n[0] = 0x7d08ffb10d4b8;
  sStack_1520.y.n[1] = 0x48a68554199c4;
  sStack_1520.y.n[2] = 0xe1108a8fd17b4;
  sStack_1520.y.n[3] = 0xc4655da4fbfc0;
  sStack_1520.z.n[0] = 1;
  sStack_1520.z.n[3] = 0;
  sStack_1520.z.n[4] = 0;
  sStack_1520.z.n[1] = 0;
  sStack_1520.z.n[2] = 0;
  sStack_15a0.infinity = 1;
  sStack_15a0.z.n[4] = 0;
  sStack_15a0.z.n[2] = 0;
  sStack_15a0.z.n[3] = 0;
  sStack_15a0.z.n[0] = 0;
  sStack_15a0.z.n[1] = 0;
  sStack_15a0.y.n[3] = 0;
  sStack_15a0.y.n[4] = 0;
  sStack_15a0.y.n[1] = 0;
  sStack_15a0.y.n[2] = 0;
  sStack_15a0.x.n[4] = 0;
  sStack_15a0.y.n[0] = 0;
  sStack_15a0.x.n[2] = 0;
  sStack_15a0.x.n[3] = 0;
  sStack_15a0.x.n[0] = 0;
  sStack_15a0.x.n[1] = 0;
  psStack_1808 = (secp256k1_strauss_point_state *)0x1647a8;
  psStack_c88 = psVar16;
  psStack_c80 = hash;
  psStack_c78 = psVar6;
  psStack_c70 = acc;
  psStack_c68 = psVar13;
  pcStack_c60 = (code *)out32;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1620,psVar15);
  psStack_1808 = (secp256k1_strauss_point_state *)0x1647f3;
  sStack_1720.x.n[0] = (uint64_t)asStack_14a0;
  sStack_1720.x.n[1] = (uint64_t)asStack_1360;
  sStack_1720.x.n[2] = (uint64_t)&sStack_10a0;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1720,&sStack_16a0,1,&sStack_1520,psVar15,
             &sStack_17e0);
  psStack_1808 = (secp256k1_strauss_point_state *)0x164824;
  sStack_1778.x.n[0] = (uint64_t)asStack_14a0;
  sStack_1778.x.n[1] = (uint64_t)asStack_1360;
  sStack_1778.x.n[2] = (uint64_t)&sStack_10a0;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1778,&sStack_1720,1,&sStack_15a0,&sStack_17e0,
             psVar15);
  psStack_1808 = (secp256k1_strauss_point_state *)0x16484d;
  secp256k1_ecmult_multi_var
            ((secp256k1_callback *)0x0,scratch,(secp256k1_gej *)&sStack_10a0,psVar15,
             (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  cb = test_ecmult_accumulate_cb;
  psStack_1808 = (secp256k1_strauss_point_state *)0x164878;
  cbdata = psVar15;
  secp256k1_ecmult_multi_var
            ((secp256k1_callback *)0x0,scratch,asStack_1360,&sStack_17e0,test_ecmult_accumulate_cb,
             psVar15,1);
  psVar16 = asStack_14a0;
  psStack_1808 = (secp256k1_strauss_point_state *)0x164892;
  secp256k1_ecmult_const(psVar16,&secp256k1_ge_const_g,psVar15);
  psStack_1808 = (secp256k1_strauss_point_state *)0x1648aa;
  secp256k1_ge_set_gej_var(&sStack_1778,&sStack_1620);
  psStack_1808 = (secp256k1_strauss_point_state *)0x1648ba;
  ge_equals_gej(&sStack_1778,&sStack_16a0);
  psStack_1808 = (secp256k1_strauss_point_state *)0x1648c5;
  ge_equals_gej(&sStack_1778,&sStack_1720);
  psStack_1808 = (secp256k1_strauss_point_state *)0x1648d0;
  ge_equals_gej(&sStack_1778,(secp256k1_gej *)&sStack_10a0);
  psStack_1808 = (secp256k1_strauss_point_state *)0x1648db;
  ge_equals_gej(&sStack_1778,asStack_1360);
  psStack_1808 = (secp256k1_strauss_point_state *)0x1648e6;
  ge_equals_gej(&sStack_1778,psVar16);
  if (sStack_1778.infinity == 0) {
    elem = &sStack_1778;
    psVar6 = asStack_17c0;
    psVar15 = (secp256k1_scalar *)0x0;
    psStack_1808 = (secp256k1_strauss_point_state *)0x164922;
    secp256k1_eckey_pubkey_serialize(elem,psVar6->magic,&sStack_17e8,0);
    if (sStack_17e8 != 0x41) {
      psStack_1808 = (secp256k1_strauss_point_state *)secp256k1_ecmult_multi_var;
      test_ecmult_accumulate_cold_1();
      r->infinity = 1;
      (r->x).n[0] = 0;
      (r->x).n[1] = 0;
      (r->x).n[2] = 0;
      (r->x).n[3] = 0;
      (r->x).n[4] = 0;
      (r->y).n[0] = 0;
      (r->y).n[1] = 0;
      (r->y).n[2] = 0;
      (r->y).n[3] = 0;
      (r->y).n[4] = 0;
      (r->z).n[0] = 0;
      (r->z).n[1] = 0;
      (r->z).n[2] = 0;
      (r->z).n[3] = 0;
      (r->z).n[4] = 0;
      if (psVar15 != (secp256k1_scalar *)0x0 || psVar14 != (secp256k1_gej *)0x0) {
        psStack_1830 = &sStack_17e8;
        psStack_1828 = &sStack_1720;
        psStack_1820 = asStack_1360;
        psStack_1818 = psVar14;
        psStack_1810 = psVar16;
        psStack_1808 = &sStack_10a0;
        if (psVar14 != (secp256k1_gej *)0x0) {
          if (psVar6 != (secp256k1_scratch *)0x0) {
            sVar11 = secp256k1_pippenger_max_points((secp256k1_callback *)elem,psVar6);
            if (sVar11 != 0) {
              uVar5 = 5000000;
              if (sVar11 < 5000000) {
                uVar5 = sVar11;
              }
              uStack_2078 = (ulong)&psVar14[-1].field_0x7f / uVar5 + 1;
              psVar16 = (secp256k1_gej *)((ulong)&psVar14[-1].field_0x7f / uStack_2078 + 1);
            }
            if (sVar11 != 0) {
              if (psVar16 < (secp256k1_gej *)0x58) {
                sVar11 = secp256k1_scratch_max_allocation((secp256k1_callback *)elem,psVar6,5);
                if (0x8af < sVar11) {
                  uVar5 = sVar11 / 0x8b0;
                  if (4999999 < uVar5) {
                    uVar5 = 5000000;
                  }
                  uStack_2078 = (ulong)&psVar14[-1].field_0x7f / uVar5 + 1;
                  psVar16 = (secp256k1_gej *)((ulong)&psVar14[-1].field_0x7f / uStack_2078 + 1);
                }
                if (sVar11 < 0x8b0) goto LAB_00164b07;
                pcVar7 = secp256k1_ecmult_strauss_batch;
              }
              else {
                pcVar7 = secp256k1_ecmult_pippenger_batch;
              }
              lVar8 = 0;
              uVar5 = 0;
              while( true ) {
                psVar13 = psVar16;
                if (psVar14 < psVar16) {
                  psVar13 = psVar14;
                }
                psVar9 = (secp256k1_scalar *)0x0;
                if (uVar5 == 0) {
                  psVar9 = psVar15;
                }
                iVar4 = (*pcVar7)(elem,psVar6,&sStack_1f08,psVar9,cb,cbdata,psVar13,lVar8);
                if (iVar4 == 0) break;
                secp256k1_gej_add_var(r,r,(secp256k1_gej *)&sStack_1f08,(secp256k1_fe *)0x0);
                psVar14 = (secp256k1_gej *)((long)psVar14 - (long)psVar13);
                uVar5 = uVar5 + 1;
                lVar8 = (long)(psVar16->x).n + lVar8;
                if (uStack_2078 == uVar5) {
                  return;
                }
              }
              return;
            }
          }
LAB_00164b07:
          secp256k1_ecmult_multi_simple_var(r,psVar15,cb,cbdata,(size_t)psVar14);
          return;
        }
        sStack_2060.aux = asStack_2048;
        sStack_2060.pre_a = asStack_1af8;
        sStack_2060.ps = &sStack_1f08;
        secp256k1_ecmult_strauss_wnaf(&sStack_2060,r,1,r,&secp256k1_scalar_zero,psVar15);
      }
      return;
    }
    sVar11 = 0x41;
  }
  else {
    asStack_17c0[0].magic[0] = '\0';
    sVar11 = 1;
  }
  psStack_1808 = (secp256k1_strauss_point_state *)0x164938;
  secp256k1_sha256_write((secp256k1_sha256 *)psVar14,asStack_17c0[0].magic,sVar11);
  return;
}

Assistant:

static void test_fixed_wnaf_small_helper(int *wnaf, int *wnaf_expected, int w) {
    int i;
    for (i = WNAF_SIZE(w)-1; i >= 8; --i) {
        CHECK(wnaf[i] == 0);
    }
    for (i = 7; i >= 0; --i) {
        CHECK(wnaf[i] == wnaf_expected[i]);
    }
}